

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

char * sqlite3_vtab_collation(sqlite3_index_info *pIdxInfo,int iCons)

{
  long lVar1;
  CollSeq *pCVar2;
  uint uVar3;
  char *pcVar4;
  
  if ((iCons < 0) || (pIdxInfo->nConstraint <= iCons)) {
    pcVar4 = (char *)0x0;
  }
  else {
    lVar1 = *(long *)(*(long *)(*(long *)(pIdxInfo + 1) + 0x20) +
                     (long)pIdxInfo->aConstraint[(uint)iCons].iTermOffset * 0x38);
    pcVar4 = "BINARY";
    if (*(long *)(lVar1 + 0x10) != 0) {
      uVar3 = *(uint *)(lVar1 + 4) & 0x400;
      pCVar2 = sqlite3BinaryCompareCollSeq
                         ((Parse *)pIdxInfo[1].aConstraint,
                          *(Expr **)(lVar1 + 0x10 + (ulong)(uVar3 >> 7)),
                          *(Expr **)(lVar1 + 0x10 + (ulong)(uVar3 == 0) * 8));
      if (pCVar2 != (CollSeq *)0x0) {
        pcVar4 = pCVar2->zName;
      }
    }
  }
  return pcVar4;
}

Assistant:

SQLITE_API const char *sqlite3_vtab_collation(sqlite3_index_info *pIdxInfo, int iCons){
  HiddenIndexInfo *pHidden = (HiddenIndexInfo*)&pIdxInfo[1];
  const char *zRet = 0;
  if( iCons>=0 && iCons<pIdxInfo->nConstraint ){
    CollSeq *pC = 0;
    int iTerm = pIdxInfo->aConstraint[iCons].iTermOffset;
    Expr *pX = pHidden->pWC->a[iTerm].pExpr;
    if( pX->pLeft ){
      pC = sqlite3ExprCompareCollSeq(pHidden->pParse, pX);
    }
    zRet = (pC ? pC->zName : sqlite3StrBINARY);
  }
  return zRet;
}